

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O2

int * Extra_PermSchedule(int n)

{
  ulong uVar1;
  int iVar2;
  int *piVar3;
  int *__ptr;
  ulong uVar4;
  int iVar5;
  long lVar6;
  int *piVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  
  iVar2 = Extra_Factorial(n);
  uVar1 = (long)((ulong)(uint)((int)((long)iVar2 / (long)n) >> 0x1f) << 0x20 |
                (long)iVar2 / (long)n & 0xffffffffU) / 2;
  piVar3 = (int *)malloc((long)iVar2 << 2);
  if (n < 1) {
    __assert_fail("n > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMisc.c"
                  ,0x8a4,"int *Extra_PermSchedule(int)");
  }
  if (n != 1) {
    if (n != 2) {
      __ptr = Extra_PermSchedule(n + -1);
      uVar4 = 0;
      uVar10 = uVar1 & 0xffffffff;
      if ((int)uVar1 < 1) {
        uVar10 = uVar4;
      }
      iVar5 = 0;
      for (; uVar4 != uVar10; uVar4 = uVar4 + 1) {
        lVar8 = (long)iVar5;
        lVar6 = lVar8 << 0x20;
        iVar5 = iVar5 + 2;
        piVar7 = piVar3 + lVar8 + 1;
        for (iVar9 = n + -2; 0 < iVar9 + 1; iVar9 = iVar9 + -1) {
          piVar3[lVar8] = iVar9;
          lVar8 = lVar8 + 1;
          lVar6 = lVar6 + 0x100000000;
          iVar5 = iVar5 + 1;
          piVar7 = piVar7 + 1;
        }
        *(int *)((long)piVar3 + (lVar6 >> 0x1e)) = __ptr[uVar4 * 2] + 1;
        lVar8 = -0x100000000;
        for (iVar9 = 0; n + -1 != iVar9; iVar9 = iVar9 + 1) {
          *piVar7 = iVar9;
          iVar5 = iVar5 + 1;
          lVar8 = lVar8 + -0x100000000;
          piVar7 = piVar7 + 1;
        }
        *(int *)((long)piVar3 + (lVar6 - lVar8 >> 0x1e)) = __ptr[uVar4 * 2 + 1];
      }
      free(__ptr);
      if (iVar5 == iVar2) {
        return piVar3;
      }
      __assert_fail("b == nFact",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMisc.c"
                    ,0x8ba,"int *Extra_PermSchedule(int)");
    }
    piVar3[1] = 0;
  }
  *piVar3 = 0;
  return piVar3;
}

Assistant:

int * Extra_PermSchedule( int n )
{
    int nFact   = Extra_Factorial(n);
    int nGroups = nFact / n / 2;
    int * pRes = ABC_ALLOC( int, nFact );
    int * pRes0, i, k, b = 0;
    assert( n > 0 );
    if ( n == 1 )
    {
        pRes[0] = 0;
        return pRes;
    }
    if ( n == 2 )
    {
        pRes[0] = pRes[1] = 0;
        return pRes;
    }
    pRes0 = Extra_PermSchedule( n-1 );
    for ( k = 0; k < nGroups; k++ )
    {
        for ( i = n-1; i > 0; i-- )
            pRes[b++] = i-1;
        pRes[b++] = pRes0[2*k]+1;
        for ( i = 0; i < n-1; i++ )
            pRes[b++] = i;
        pRes[b++] = pRes0[2*k+1];
    }
    ABC_FREE( pRes0 );
    assert( b == nFact );

    if ( 0 )
    {
        int Perm[16];
        for ( i = 0; i < n; i++ )
            Perm[i] = i;
        for ( b = 0; b < nFact; b++ )
        {
            ABC_SWAP( int, Perm[pRes[b]], Perm[pRes[b]+1] );
            printf( "%3d %3d    ", b, pRes[b] );
            for ( i = 0; i < n; i++ )
                printf( "%d", Perm[i] );
            printf( "\n" );
        }
    }
    return pRes;
}